

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestReader.cpp
# Opt level: O0

void __thiscall OpenMD::RestReader::readSet(RestReader *this)

{
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  long in_RDI;
  istream *inputStream;
  string line;
  streamoff in_stack_ffffffffffffff88;
  fpos<__mbstate_t> *in_stack_ffffffffffffff90;
  errorStruct *peVar4;
  undefined8 local_48;
  undefined8 local_40;
  string local_28 [16];
  istream *in_stack_ffffffffffffffe8;
  RestReader *in_stack_fffffffffffffff0;
  
  std::__cxx11::string::string(local_28);
  std::ios::clear((int)*(long **)(in_RDI + 0x38) +
                  (int)*(undefined8 *)(**(long **)(in_RDI + 0x38) + -0x18));
  uVar1 = *(undefined8 *)(in_RDI + 0x38);
  std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::istream::seekg(uVar1,local_48,local_40);
  pcVar2 = *(char **)(in_RDI + 0x38);
  std::istream::getline(pcVar2,in_RDI + 0x68);
  std::__cxx11::string::operator=(local_28,(char *)(in_RDI + 0x68));
  lVar3 = std::__cxx11::string::find((char *)local_28,0x3aae66);
  if (lVar3 == -1) {
    snprintf(painCave.errMsg,2000,"RestReader Error: can not find <Snapshot>\n");
    painCave.isFatal = 1;
    simError();
  }
  readFrameProperties(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  readStuntDoubles(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::istream::getline(pcVar2,in_RDI + 0x68);
  std::__cxx11::string::operator=(local_28,(char *)(in_RDI + 0x68));
  lVar3 = std::__cxx11::string::find((char *)local_28,0x3aaead);
  if (lVar3 == -1) {
    peVar4 = &painCave;
    snprintf(painCave.errMsg,2000,"RestReader Error: can not find </Snapshot>\n");
    peVar4->isFatal = 1;
    simError();
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void RestReader::readSet() {
    std::string line;

#ifndef IS_MPI

    inFile_->clear();
    inFile_->seekg(framePos_);

    std::istream& inputStream = *inFile_;
#else

    int primaryNode = 0;
    std::stringstream sstream;
    if (worldRank == primaryNode) {
      std::string sendBuffer;

      inFile_->clear();
      inFile_->seekg(framePos_);

      while (inFile_->getline(buffer, bufferSize)) {
        line = buffer;
        sendBuffer += line;
        sendBuffer += '\n';
        if (line.find("</Snapshot>") != std::string::npos) { break; }
      }

      int sendBufferSize = sendBuffer.size();
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      MPI_Bcast((void*)sendBuffer.c_str(), sendBufferSize, MPI_CHAR,
                primaryNode, MPI_COMM_WORLD);

      sstream.str(sendBuffer);
    } else {
      int sendBufferSize;
      MPI_Bcast(&sendBufferSize, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
      char* recvBuffer = new char[sendBufferSize + 1];
      assert(recvBuffer);
      recvBuffer[sendBufferSize] = '\0';
      MPI_Bcast(recvBuffer, sendBufferSize, MPI_CHAR, primaryNode,
                MPI_COMM_WORLD);
      sstream.str(recvBuffer);
      delete[] recvBuffer;
    }

    std::istream& inputStream = sstream;
#endif

    inputStream.getline(buffer, bufferSize);

    line = buffer;
    if (line.find("<Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find <Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }

    // read frameData
    readFrameProperties(inputStream);

    // read StuntDoubles
    readStuntDoubles(inputStream);

    inputStream.getline(buffer, bufferSize);
    line = buffer;
    if (line.find("</Snapshot>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RestReader Error: can not find </Snapshot>\n");
      painCave.isFatal = 1;
      simError();
    }
  }